

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::Render(void)

{
  bool bVar1;
  ImGuiWindow **ppIVar2;
  int n_1;
  ImGuiWindow *window;
  int n;
  ImGuiWindow *windows_to_render_top_most [2];
  ImGuiContext *g;
  ImU32 in_stack_00000144;
  ImU32 in_stack_00000148;
  ImU32 in_stack_0000014c;
  ImGuiMouseCursor in_stack_00000150;
  float in_stack_00000154;
  ImDrawList *in_stack_00000158;
  ImVec2 in_stack_00000160;
  ImDrawList *in_stack_ffffffffffffffb8;
  ImGuiWindow *draw_list;
  ImVector<ImDrawList_*> *in_stack_ffffffffffffffc0;
  ImGuiWindow *window_00;
  int local_2c;
  ImGuiWindow *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int i;
  ImGuiWindow *local_18 [2];
  ImGuiContext *local_8;
  
  local_8 = GImGui;
  if (GImGui->FrameCountEnded != GImGui->FrameCount) {
    EndFrame();
  }
  local_8->FrameCountRendered = local_8->FrameCount;
  (local_8->IO).MetricsRenderWindows = 0;
  ImDrawDataBuilder::Clear((ImDrawDataBuilder *)in_stack_ffffffffffffffc0);
  CallContextHooks((ImGuiContext *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                   (ImGuiContextHookType)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
  bVar1 = ImVector<ImDrawVert>::empty(&(local_8->BackgroundDrawList).VtxBuffer);
  if (!bVar1) {
    AddDrawListToDrawData(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  }
  if ((local_8->NavWindowingTarget == (ImGuiWindow *)0x0) ||
     ((local_8->NavWindowingTarget->Flags & 0x2000U) != 0)) {
    window_00 = (ImGuiWindow *)0x0;
  }
  else {
    window_00 = local_8->NavWindowingTarget->RootWindow;
  }
  local_18[0] = window_00;
  if (local_8->NavWindowingTarget == (ImGuiWindow *)0x0) {
    draw_list = (ImGuiWindow *)0x0;
  }
  else {
    draw_list = local_8->NavWindowingListWindow;
  }
  local_18[1] = draw_list;
  for (i = 0; i != (local_8->Windows).Size; i = i + 1) {
    ppIVar2 = ImVector<ImGuiWindow_*>::operator[](&local_8->Windows,i);
    in_stack_ffffffffffffffd8 = *ppIVar2;
    bVar1 = IsWindowActiveAndVisible(in_stack_ffffffffffffffd8);
    if ((((bVar1) && ((in_stack_ffffffffffffffd8->Flags & 0x1000000U) == 0)) &&
        (in_stack_ffffffffffffffd8 != local_18[0])) && (in_stack_ffffffffffffffd8 != local_18[1])) {
      AddRootWindowToDrawData(window_00);
    }
  }
  for (local_2c = 0; local_2c < 2; local_2c = local_2c + 1) {
    if ((local_18[local_2c] != (ImGuiWindow *)0x0) &&
       (bVar1 = IsWindowActiveAndVisible(local_18[local_2c]), bVar1)) {
      AddRootWindowToDrawData(window_00);
    }
  }
  ImDrawDataBuilder::FlattenIntoSingleLayer
            ((ImDrawDataBuilder *)CONCAT44(i,in_stack_ffffffffffffffe0));
  if (((local_8->IO).MouseDrawCursor & 1U) != 0) {
    RenderMouseCursor(in_stack_00000158,in_stack_00000160,in_stack_00000154,in_stack_00000150,
                      in_stack_0000014c,in_stack_00000148,in_stack_00000144);
  }
  bVar1 = ImVector<ImDrawVert>::empty(&(local_8->ForegroundDrawList).VtxBuffer);
  if (!bVar1) {
    AddDrawListToDrawData((ImVector<ImDrawList_*> *)window_00,(ImDrawList *)draw_list);
  }
  SetupDrawData((ImVector<ImDrawList_*> *)CONCAT44(i,in_stack_ffffffffffffffe0),
                (ImDrawData *)in_stack_ffffffffffffffd8);
  (local_8->IO).MetricsRenderVertices = (local_8->DrawData).TotalVtxCount;
  (local_8->IO).MetricsRenderIndices = (local_8->DrawData).TotalIdxCount;
  CallContextHooks((ImGuiContext *)CONCAT44(i,in_stack_ffffffffffffffe0),
                   (ImGuiContextHookType)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
  return;
}

Assistant:

void ImGui::Render()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);

    if (g.FrameCountEnded != g.FrameCount)
        EndFrame();
    g.FrameCountRendered = g.FrameCount;
    g.IO.MetricsRenderWindows = 0;
    g.DrawDataBuilder.Clear();

    CallContextHooks(&g, ImGuiContextHookType_RenderPre);

    // Add background ImDrawList
    if (!g.BackgroundDrawList.VtxBuffer.empty())
        AddDrawListToDrawData(&g.DrawDataBuilder.Layers[0], &g.BackgroundDrawList);

    // Add ImDrawList to render
    ImGuiWindow* windows_to_render_top_most[2];
    windows_to_render_top_most[0] = (g.NavWindowingTarget && !(g.NavWindowingTarget->Flags & ImGuiWindowFlags_NoBringToFrontOnFocus)) ? g.NavWindowingTarget->RootWindow : NULL;
    windows_to_render_top_most[1] = (g.NavWindowingTarget ? g.NavWindowingListWindow : NULL);
    for (int n = 0; n != g.Windows.Size; n++)
    {
        ImGuiWindow* window = g.Windows[n];
        if (IsWindowActiveAndVisible(window) && (window->Flags & ImGuiWindowFlags_ChildWindow) == 0 && window != windows_to_render_top_most[0] && window != windows_to_render_top_most[1])
            AddRootWindowToDrawData(window);
    }
    for (int n = 0; n < IM_ARRAYSIZE(windows_to_render_top_most); n++)
        if (windows_to_render_top_most[n] && IsWindowActiveAndVisible(windows_to_render_top_most[n])) // NavWindowingTarget is always temporarily displayed as the top-most window
            AddRootWindowToDrawData(windows_to_render_top_most[n]);
    g.DrawDataBuilder.FlattenIntoSingleLayer();

    // Draw software mouse cursor if requested
    if (g.IO.MouseDrawCursor)
        RenderMouseCursor(&g.ForegroundDrawList, g.IO.MousePos, g.Style.MouseCursorScale, g.MouseCursor, IM_COL32_WHITE, IM_COL32_BLACK, IM_COL32(0, 0, 0, 48));

    // Add foreground ImDrawList
    if (!g.ForegroundDrawList.VtxBuffer.empty())
        AddDrawListToDrawData(&g.DrawDataBuilder.Layers[0], &g.ForegroundDrawList);

    // Setup ImDrawData structure for end-user
    SetupDrawData(&g.DrawDataBuilder.Layers[0], &g.DrawData);
    g.IO.MetricsRenderVertices = g.DrawData.TotalVtxCount;
    g.IO.MetricsRenderIndices = g.DrawData.TotalIdxCount;

    CallContextHooks(&g, ImGuiContextHookType_RenderPost);
}